

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-remove-annotations.cc
# Opt level: O3

int realmain(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  char *__end;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf_sp;
  QPDFObjectHandle page;
  QPDFJob j;
  _Head_base<0UL,_QPDF_*,_false> local_80;
  long *local_78 [2];
  long local_68 [2];
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  QPDFJob local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  QPDF *local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  QUtil::setLineBuf(_stdout);
  QPDFJob::QPDFJob(local_48);
  QPDFJob::initializeFromArgv((char **)local_48,(char *)argv);
  QPDFJob::createQPDF();
  local_38 = local_80._M_head_impl;
  plVar3 = (long *)QPDF::getAllPages();
  puVar4 = (undefined8 *)*plVar3;
  puVar1 = (undefined8 *)plVar3[1];
  if (puVar4 != puVar1) {
    do {
      local_58 = *puVar4;
      local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[1];
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_50 + 8) = *(int *)(local_50 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_50 + 8) = *(int *)(local_50 + 8) + 1;
        }
      }
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"/Annots","");
      QPDFObjectHandle::removeKey((string *)&local_58);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar1);
  }
  QPDFJob::writeQPDF((QPDF *)local_48);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_80);
  iVar2 = QPDFJob::getExitCode();
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return iVar2;
}

Assistant:

int
realmain(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);
    QUtil::setLineBuf(stdout);

    QPDFJob j;
    try {
        // See "HOW TO ADD A COMMAND-LINE ARGUMENT" in README-maintainer.
        j.initializeFromArgv(argv);
        auto qpdf_sp = j.createQPDF();
        auto& pdf = *qpdf_sp;
        for (auto page: pdf.getAllPages()) {
            page.removeKey("/Annots");
        }
        j.writeQPDF(pdf);
    } catch (QPDFUsage& e) {
        usageExit(e.what());
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << '\n';
        return QPDFJob::EXIT_ERROR;
    }
    return j.getExitCode();
}